

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_reader.hpp
# Opt level: O0

ptrdiff_t __thiscall
pstore::http::
buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
::pos(buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
      *this,iterator *s)

{
  iterator *piVar1;
  bool bVar2;
  difference_type dVar3;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_48;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_38;
  span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false> local_28;
  iterator *local_18;
  iterator *s_local;
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  *this_local;
  
  local_18 = s;
  s_local = (iterator *)this;
  pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&local_28);
  bVar2 = pstore::gsl::details::operator>=(s,&local_28);
  piVar1 = local_18;
  if (bVar2) {
    pstore::gsl::span<unsigned_char,_-1L>::end((span<unsigned_char,__1L> *)&local_38);
    bVar2 = pstore::gsl::details::operator<=(piVar1,&local_38);
    piVar1 = local_18;
    if (bVar2) {
      pstore::gsl::span<unsigned_char,_-1L>::begin((span<unsigned_char,__1L> *)&local_48);
      dVar3 = pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>::
              operator-(piVar1,&local_48);
      return dVar3;
    }
  }
  assert_failed("s >= span_.begin () && s <= span_.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/http/buffered_reader.hpp"
                ,0x82);
}

Assistant:

std::ptrdiff_t pos (gsl::span<std::uint8_t>::iterator const & s) noexcept {
                PSTORE_ASSERT (s >= span_.begin () && s <= span_.end ());
                return s - span_.begin ();
            }